

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_getSetHasModel_Test::~Annotator_getSetHasModel_Test(Annotator_getSetHasModel_Test *this)

{
  Annotator_getSetHasModel_Test *this_local;
  
  ~Annotator_getSetHasModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, getSetHasModel)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();

    EXPECT_FALSE(annotator->hasModel());
    EXPECT_EQ(nullptr, annotator->model());

    annotator->setModel(model);

    EXPECT_TRUE(annotator->hasModel());
    EXPECT_NE(nullptr, annotator->model());
}